

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meaning.cpp
# Opt level: O1

Trampoline * __thiscall
SequenceMeaning::Eval(Trampoline *__return_storage_ptr__,SequenceMeaning *this,Sexp *act)

{
  pointer ppSVar1;
  Sexp *pSVar2;
  Sexp **entry;
  pointer ppSVar3;
  ContractFrameProtector local_40;
  ContractFrameProtector __contract_frame;
  FrameProtector __frame_prot;
  Sexp *act_local;
  
  __frame_prot.protected_frame = (Frame *)act;
  ContractFrameProtector::ContractFrameProtector(&local_40,"Eval");
  ContractFrame::CheckPrecondition
            (local_40.protected_frame,*(int *)&(__frame_prot.protected_frame)->name == 7,
             "act->IsActivation()");
  FrameProtector::FrameProtector((FrameProtector *)&__contract_frame,"Eval");
  FrameProtector::ProtectValue((FrameProtector *)&__contract_frame,(Sexp **)&__frame_prot,"act");
  ppSVar1 = (this->body).super__Vector_base<Sexp_*,_std::allocator<Sexp_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppSVar3 = (this->body).super__Vector_base<Sexp_*,_std::allocator<Sexp_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppSVar3 != ppSVar1; ppSVar3 = ppSVar3 + 1) {
    Evaluate(*ppSVar3,(Sexp *)__frame_prot.protected_frame);
  }
  pSVar2 = this->final_form;
  __return_storage_ptr__->kind = Thunk;
  __return_storage_ptr__->field_1 =
       (anon_union_8_2_75fd101e_for_Trampoline_2)__frame_prot.protected_frame;
  __return_storage_ptr__->meaning = pSVar2;
  FrameProtector::~FrameProtector((FrameProtector *)&__contract_frame);
  ContractFrameProtector::~ContractFrameProtector(&local_40);
  return __return_storage_ptr__;
}

Assistant:

Trampoline SequenceMeaning::Eval(Sexp *act) {
  CONTRACT { PRECONDITION(act->IsActivation()); }